

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_data_priority_add_child(Curl_easy *parent,Curl_easy *child,_Bool exclusive)

{
  undefined1 *puVar1;
  Curl_easy *parent_00;
  Curl_data_prio_node *pCVar2;
  Curl_data_prio_node *pCVar3;
  Curl_data_prio_node *pCVar4;
  Curl_data_prio_node *pCVar5;
  Curl_data_prio_node *pCVar6;
  
  parent_00 = (child->set).priority.parent;
  if (parent_00 != (Curl_easy *)0x0) {
    priority_remove_child(parent_00,child);
  }
  if (parent != (Curl_easy *)0x0) {
    pCVar2 = (Curl_data_prio_node *)(*Curl_ccalloc)(1,0x10);
    if (pCVar2 == (Curl_data_prio_node *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar2->data = child;
    pCVar3 = (Curl_data_prio_node *)&(parent->set).priority.children;
    pCVar4 = (parent->set).priority.children;
    pCVar5 = pCVar4;
    if (exclusive && pCVar4 != (Curl_data_prio_node *)0x0) {
      for (; pCVar5 != (Curl_data_prio_node *)0x0; pCVar5 = pCVar5->next) {
        (pCVar5->data->set).priority.parent = child;
      }
      pCVar5 = (Curl_data_prio_node *)&(child->set).priority.children;
      do {
        pCVar6 = pCVar5;
        pCVar5 = pCVar6->next;
      } while (pCVar5 != (Curl_data_prio_node *)0x0);
      pCVar6->next = pCVar4;
      *(Curl_data_prio_node **)pCVar3 = (Curl_data_prio_node *)0x0;
      pCVar4 = (Curl_data_prio_node *)0x0;
    }
    while (pCVar4 != (Curl_data_prio_node *)0x0) {
      puVar1 = &(pCVar4->data->set).priority.field_0x14;
      *puVar1 = *puVar1 & 0xfe;
      pCVar3 = pCVar3->next;
      pCVar4 = pCVar3->next;
    }
    pCVar3->next = pCVar2;
  }
  (child->set).priority.parent = parent;
  (child->set).priority.field_0x14 = (child->set).priority.field_0x14 & 0xfe | exclusive;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_data_priority_add_child(struct Curl_easy *parent,
                                      struct Curl_easy *child,
                                      bool exclusive)
{
  if(child->set.priority.parent) {
    priority_remove_child(child->set.priority.parent, child);
  }

  if(parent) {
    struct Curl_data_prio_node **tail;
    struct Curl_data_prio_node *pnode;

    pnode = calloc(1, sizeof(*pnode));
    if(!pnode)
      return CURLE_OUT_OF_MEMORY;
    pnode->data = child;

    if(parent->set.priority.children && exclusive) {
      /* exclusive: move all existing children underneath the new child */
      struct Curl_data_prio_node *node = parent->set.priority.children;
      while(node) {
        node->data->set.priority.parent = child;
        node = node->next;
      }

      tail = &child->set.priority.children;
      while(*tail)
        tail = &(*tail)->next;

      DEBUGASSERT(!*tail);
      *tail = parent->set.priority.children;
      parent->set.priority.children = 0;
    }

    tail = &parent->set.priority.children;
    while(*tail) {
      (*tail)->data->set.priority.exclusive = FALSE;
      tail = &(*tail)->next;
    }

    DEBUGASSERT(!*tail);
    *tail = pnode;
  }

  child->set.priority.parent = parent;
  child->set.priority.exclusive = exclusive;
  return CURLE_OK;
}